

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O1

void vfll32(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,uintptr_t retaddr)

{
  byte bVar1;
  float64 fVar2;
  long lVar3;
  bool bVar4;
  uint8_t vec_exc;
  S390Vector tmp;
  byte local_59;
  uintptr_t local_58;
  S390Vector *local_50;
  float64 local_48;
  uint64_t uStack_40;
  
  local_59 = 0;
  local_48 = 0;
  uStack_40 = 0;
  lVar3 = 0;
  local_58 = retaddr;
  local_50 = v1;
  do {
    fVar2 = float32_to_float64_s390x(*(float32 *)((long)v2 + lVar3 * 4 + 4),&env->fpu_status);
    *(float64 *)((long)&local_48 + lVar3 * 4) = fVar2;
    bVar1 = check_ieee_exc(env,(uint8_t)lVar3,false,&local_59);
    if (bVar1 != 0 || s) break;
    bVar4 = lVar3 == 0;
    lVar3 = lVar3 + 2;
  } while (bVar4);
  if (bVar1 == 0) {
    if (local_59 != 0) {
      env->fpc = env->fpc | (uint)local_59 << 0x10;
    }
    local_50->doubleword[0] = local_48;
    local_50->doubleword[1] = uStack_40;
    return;
  }
  tcg_s390_vector_exception(env,(uint)bVar1,local_58);
}

Assistant:

static void vfll32(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i;

    for (i = 0; i < 2; i++) {
        /* load from even element */
        const float32 a = s390_vec_read_element32(v2, i * 2);
        const uint64_t ret = float32_to_float64(a, &env->fpu_status);

        s390_vec_write_element64(&tmp, i, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i * 2, false, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}